

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.hpp
# Opt level: O2

string * __thiscall
duckdb::FullLinePosition::
ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
          (string *__return_storage_ptr__,FullLinePosition *this,bool *first_char_nl,
          unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
          *buffer_handles,bool reconstruct_line)

{
  LinePosition *other;
  idx_t *__k;
  idx_t *__k_00;
  idx_t iVar1;
  bool bVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  CSVBufferHandle *pCVar5;
  data_ptr_t pdVar6;
  size_type *psVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined3 in_register_00000081;
  idx_t i;
  ulong uVar10;
  string local_50;
  
  if (CONCAT31(in_register_00000081,reconstruct_line) == 0) {
LAB_01aee30a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  other = &this->end;
  bVar2 = LinePosition::operator==(&this->begin,other);
  if (bVar2) goto LAB_01aee30a;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  __k = &(this->end).buffer_idx;
  __k_00 = &(this->begin).buffer_idx;
  if ((this->end).buffer_idx == (this->begin).buffer_idx) {
    iVar3 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&buffer_handles->_M_h,__k);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_false>
        ._M_cur == (__node_type *)0x0) {
LAB_01aee486:
      paVar9 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar9;
      psVar7 = &__return_storage_ptr__->_M_string_length;
      goto LAB_01aee4f7;
    }
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)buffer_handles,__k_00);
    pCVar5 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar4);
    pdVar6 = BufferHandle::Ptr(&pCVar5->handle);
    iVar1 = (this->begin).buffer_pos;
    bVar2 = pdVar6[iVar1] == '\r' || pdVar6[iVar1] == '\n';
    *first_char_nl = bVar2;
    for (uVar10 = bVar2 + iVar1; uVar10 < other->buffer_pos; uVar10 = uVar10 + 1) {
      ::std::__cxx11::string::push_back((char)&local_50);
    }
  }
  else {
    iVar3 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&buffer_handles->_M_h,__k_00);
    if ((iVar3.
         super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_false>
         ._M_cur == (__node_type *)0x0) ||
       (iVar3 = ::std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&buffer_handles->_M_h,__k),
       iVar3.
       super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_false>
       ._M_cur == (__node_type *)0x0)) goto LAB_01aee486;
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)buffer_handles,__k_00);
    pCVar5 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar4);
    pdVar6 = BufferHandle::Ptr(&pCVar5->handle);
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)buffer_handles,__k_00);
    pCVar5 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar4);
    uVar10 = pCVar5->actual_size;
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)buffer_handles,__k);
    pCVar5 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar4);
    BufferHandle::Ptr(&pCVar5->handle);
    iVar1 = (this->begin).buffer_pos;
    bVar2 = pdVar6[iVar1] == '\r' || pdVar6[iVar1] == '\n';
    *first_char_nl = bVar2;
    for (uVar8 = bVar2 + iVar1; uVar8 < uVar10; uVar8 = uVar8 + 1) {
      ::std::__cxx11::string::push_back((char)&local_50);
    }
    for (uVar10 = 0; uVar10 < other->buffer_pos; uVar10 = uVar10 + 1) {
      ::std::__cxx11::string::push_back((char)&local_50);
    }
  }
  paVar9 = &local_50.field_2;
  SanitizeError(&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar9) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_50.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0]);
  }
  psVar7 = &local_50._M_string_length;
  __return_storage_ptr__->_M_string_length = local_50._M_string_length;
  local_50._M_dataplus._M_p = (pointer)paVar9;
LAB_01aee4f7:
  *psVar7 = 0;
  paVar9->_M_local_buf[0] = '\0';
  ::std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

string ReconstructCurrentLine(bool &first_char_nl, T &buffer_handles, bool reconstruct_line) const {
		if (!reconstruct_line || begin == end) {
			return {};
		}
		string result;
		if (end.buffer_idx == begin.buffer_idx) {
			if (buffer_handles.find(end.buffer_idx) == buffer_handles.end()) {
				return {};
			}
			auto buffer = buffer_handles[begin.buffer_idx]->Ptr();
			first_char_nl = buffer[begin.buffer_pos] == '\n' || buffer[begin.buffer_pos] == '\r';
			for (idx_t i = begin.buffer_pos + first_char_nl; i < end.buffer_pos; i++) {
				result += buffer[i];
			}
		} else {
			if (buffer_handles.find(begin.buffer_idx) == buffer_handles.end() ||
			    buffer_handles.find(end.buffer_idx) == buffer_handles.end()) {
				return {};
			}
			auto first_buffer = buffer_handles[begin.buffer_idx]->Ptr();
			auto first_buffer_size = buffer_handles[begin.buffer_idx]->actual_size;
			auto second_buffer = buffer_handles[end.buffer_idx]->Ptr();
			first_char_nl = first_buffer[begin.buffer_pos] == '\n' || first_buffer[begin.buffer_pos] == '\r';
			for (idx_t i = begin.buffer_pos + first_char_nl; i < first_buffer_size; i++) {
				result += first_buffer[i];
			}
			for (idx_t i = 0; i < end.buffer_pos; i++) {
				result += second_buffer[i];
			}
		}
		// sanitize borked line
		SanitizeError(result);
		return result;
	}